

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O3

int __thiscall
section_data::analyze_line_seg(section_data *this,int *line_start,int *line_end,int layer)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  int line_type;
  int local_20;
  int local_1c;
  
  local_20 = layer;
  local_1c = calibrate_line(line_start,line_end);
  iVar1 = set_section_type(&local_1c,&this->axis_type);
  switch(iVar1) {
  case 1:
    slice_horiz_horiz(this,line_start,line_end,&local_20);
    break;
  case 2:
    slice_horiz_angled(this,line_start,line_end,&local_20);
    break;
  case 3:
    slice_horiz_vertical(this,line_start,line_end,&local_20);
    break;
  case 4:
    slice_angled_horiz(this,line_start,line_end,&local_20);
    break;
  case 5:
    slice_angled_angled(this,line_start,line_end,&local_20);
    break;
  case 6:
    slice_angled_vertical(this,line_start,line_end,&local_20);
    break;
  case 7:
    slice_vertical_horiz(this,line_start,line_end,&local_20);
    break;
  case 8:
    slice_vertical_angled(this,line_start,line_end,&local_20);
    break;
  case 9:
    slice_vert_vert(this,line_start,line_end,&local_20);
    break;
  default:
    if (iVar1 == 99) {
      pcVar3 = "Error analyzing line_segment. Unrecognized cross-section interaction.";
      lVar2 = 0x45;
    }
    else {
      pcVar3 = "Error analyzing line_segment. Unhandled state.";
      lVar2 = 0x2e;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar3,lVar2);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
    return 1;
  }
  return 0;
}

Assistant:

int section_data::analyze_line_seg(int line_start[2], int line_end[2],
                                   int layer) // axis_type
{
  // enforce sorting
  int line_type = calibrate_line(line_start, line_end);
  int section_type = set_section_type(line_type, axis_type);
  int ret;
  // map<int, vector<double>> layer_intercepts;          // key = layer number
  switch (section_type) {
  case 1: // Horizontal-horizontal
    ret = slice_horiz_horiz(line_start, line_end, layer);
    break;
  case 2: // Horizontal-angled
    ret = slice_horiz_angled(line_start, line_end, layer);
    break;
  case 3: // Horizontal-vertical
    ret = slice_horiz_vertical(line_start, line_end, layer);
    break;
  case 4: // Angled-horizontal
    ret = slice_angled_horiz(line_start, line_end, layer);
    break;
  case 5: // Angled-angled
    ret = slice_angled_angled(line_start, line_end, layer);
    break;
  case 6: // Angled-vertical
    ret = slice_angled_vertical(line_start, line_end, layer);
    break;
  case 7: // Vertical-horizontal
    ret = slice_vertical_horiz(line_start, line_end, layer);
    break;
  case 8: // Vertical-angled
    ret = slice_vertical_angled(line_start, line_end, layer);
    break;
  case 9: // Vertical-vertical
    ret = slice_vert_vert(line_start, line_end, layer);
    break;
  case 99:
    cout << "Error analyzing line_segment. Unrecognized cross-section "
            "interaction."
         << endl;
    ret = EXIT_FAILURE;
    break;
  default:
    cout << "Error analyzing line_segment. Unhandled state." << endl;
    ret = EXIT_FAILURE;
    break;
  }
  return ret;
}